

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQSharedState::RunMark(SQSharedState *this,SQVM *vm,SQCollectable_conflict **tchain)

{
  SQCollectable_conflict **in_RDX;
  RefTable *in_RSI;
  SQCollectable_conflict **in_RDI;
  SQVM *vms;
  SQCollectable_conflict *o;
  
  o = in_RDI[0x13];
  (*(o->super_SQRefCounted)._vptr_SQRefCounted[4])(o,in_RDX);
  RefTable::Mark(in_RSI,in_RDX);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  MarkObject((SQObjectPtr *)o,in_RDI);
  return;
}

Assistant:

void SQSharedState::RunMark(SQVM* SQ_UNUSED_ARG(vm),SQCollectable **tchain)
{
    SQVM *vms = _thread(_root_vm);

    vms->Mark(tchain);

    _refs_table.Mark(tchain);
    MarkObject(_registry,tchain);
    MarkObject(_consts,tchain);
    MarkObject(_metamethodsmap,tchain);
    MarkObject(_table_default_delegate,tchain);
    MarkObject(_array_default_delegate,tchain);
    MarkObject(_string_default_delegate,tchain);
    MarkObject(_number_default_delegate,tchain);
    MarkObject(_generator_default_delegate,tchain);
    MarkObject(_thread_default_delegate,tchain);
    MarkObject(_closure_default_delegate,tchain);
    MarkObject(_class_default_delegate,tchain);
    MarkObject(_instance_default_delegate,tchain);
    MarkObject(_weakref_default_delegate,tchain);

}